

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::ReorganizeDataLayerParams::_InternalParse
          (ReorganizeDataLayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  uint uVar5;
  pair<const_char_*,_unsigned_int> pVar6;
  pair<const_char_*,_unsigned_long> pVar7;
  byte *local_30;
  
  local_30 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_30;
      uVar5 = (uint)bVar1;
      p = local_30 + 1;
      if ((char)bVar1 < '\0') {
        uVar5 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar6 = google::protobuf::internal::ReadTagFallback((char *)local_30,uVar5);
          p = (byte *)pVar6.first;
          uVar5 = pVar6.second;
        }
        else {
          p = local_30 + 2;
        }
      }
      local_30 = p;
      if (uVar5 >> 3 == 2) {
        if ((char)uVar5 != '\x10') goto LAB_00276da6;
        uVar4 = (ulong)(char)*p;
        local_30 = p + 1;
        if ((long)uVar4 < 0) {
          uVar5 = ((uint)*local_30 * 0x80 + (uint)*p) - 0x80;
          if ((char)*local_30 < '\0') {
            local_30 = p;
            pVar7 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar5);
            local_30 = (byte *)pVar7.first;
            this->blocksize_ = pVar7.second;
            goto LAB_00276de2;
          }
          uVar4 = (ulong)uVar5;
          local_30 = p + 2;
        }
        this->blocksize_ = uVar4;
      }
      else if ((uVar5 >> 3 == 1) && ((char)uVar5 == '\b')) {
        uVar4 = (ulong)(char)*p;
        local_30 = p + 1;
        if ((long)uVar4 < 0) {
          uVar5 = ((uint)*local_30 * 0x80 + (uint)*p) - 0x80;
          if (-1 < (char)*local_30) {
            uVar4 = (ulong)uVar5;
            local_30 = p + 2;
            goto LAB_00276d59;
          }
          local_30 = p;
          pVar7 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar5);
          iVar3 = (int)pVar7.second;
          local_30 = (byte *)pVar7.first;
          if (local_30 == (byte *)0x0) {
            return (char *)0x0;
          }
        }
        else {
LAB_00276d59:
          iVar3 = (int)uVar4;
        }
        this->mode_ = iVar3;
      }
      else {
LAB_00276da6:
        if ((uVar5 == 0) || ((uVar5 & 7) == 4)) {
          if (p == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar5 - 1;
          return (char *)p;
        }
        uVar4 = this_00->ptr_;
        if ((uVar4 & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar4 & 0xfffffffffffffffc) + 8);
        }
        local_30 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (uVar5,unknown,(char *)local_30,ctx);
LAB_00276de2:
        if (local_30 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_30;
}

Assistant:

const char* ReorganizeDataLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.ReorganizeDataLayerParams.ReorganizationType mode = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_mode(static_cast<::CoreML::Specification::ReorganizeDataLayerParams_ReorganizationType>(val));
        } else
          goto handle_unusual;
        continue;
      // uint64 blockSize = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          blocksize_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}